

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

CloudNode * Cloud_bddAnd(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  CloudNode *pCVar1;
  
  if (g < (CloudNode *)0x2 || f < (CloudNode *)0x2) {
    return (CloudNode *)0x0;
  }
  pCVar1 = dd->tUnique;
  if ((pCVar1 <= f) && (f < pCVar1 + dd->nNodesAlloc)) {
    if ((pCVar1 <= g) && (g < pCVar1 + dd->nNodesAlloc)) {
      if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
        cloudCacheAllocate(dd,CLOUD_OPER_AND);
      }
      pCVar1 = cloudBddAnd_gate(dd,f,g);
      return pCVar1;
    }
    __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                  ,0x1ee,"CloudNode *Cloud_bddAnd(CloudManager *, CloudNode *, CloudNode *)");
  }
  __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                ,0x1ed,"CloudNode *Cloud_bddAnd(CloudManager *, CloudNode *, CloudNode *)");
}

Assistant:

CloudNode * Cloud_bddAnd( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    return cloudBddAnd_gate( dd, f, g );
}